

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int pushglobalfuncname(lua_State *L,lua_Debug *ar)

{
  int idx;
  int iVar1;
  
  idx = lua_gettop(L);
  lua_getinfo(L,"f",ar);
  lua_rawgeti(L,-0xf4628,2);
  iVar1 = findfield(L,idx + 1,2);
  if (iVar1 != 0) {
    lua_copy(L,-1,idx + 1);
    idx = -3;
  }
  lua_settop(L,idx);
  return (uint)(iVar1 != 0);
}

Assistant:

static int pushglobalfuncname (lua_State *L, lua_Debug *ar) {
  int top = lua_gettop(L);
  lua_getinfo(L, "f", ar);  /* push function */
  lua_pushglobaltable(L);
  if (findfield(L, top + 1, 2)) {
    lua_copy(L, -1, top + 1);  /* move name to proper place */
    lua_pop(L, 2);  /* remove pushed values */
    return 1;
  }
  else {
    lua_settop(L, top);  /* remove function and global table */
    return 0;
  }
}